

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O2

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFullModel
          (ModelLoader *this,Model *fullModel,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *removedJointPositions,string param_4)

{
  char cVar1;
  bool bVar2;
  Model local_150 [304];
  
  iDynTree::Model::Model(local_150);
  iDynTree::Model::getPackageDirs_abi_cxx11_();
  iDynTree::Model::setPackageDirs((vector *)local_150);
  cVar1 = iDynTree::createReducedModel
                    (fullModel,(vector *)consideredJoints,local_150,
                     (unordered_map *)removedJointPositions);
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = ModelLoaderPimpl::setModel
                      ((this->m_pimpl)._M_t.
                       super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                       .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>.
                       _M_head_impl,local_150);
  }
  iDynTree::Model::~Model(local_150);
  return bVar2;
}

Assistant:

bool ModelLoader::loadReducedModelFromFullModel(const Model& fullModel,
                                                    const std::vector< std::string >& consideredJoints,
                                                    const std::unordered_map<std::string, double>& removedJointPositions,
                                                    const std::string /*filetype*/)
    {
        Model _modelReduced;
        _modelReduced.setPackageDirs(fullModel.getPackageDirs());
        bool ok = createReducedModel(fullModel,consideredJoints,_modelReduced, removedJointPositions);

        if( !ok )
        {
            return false;
        }

        return m_pimpl->setModel(_modelReduced);
    }